

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void __thiscall
kratos::DependencyVisitor::CombinationBlockVisitor::visit
          (CombinationBlockVisitor *this,IfStmt *stmt)

{
  bool bVar1;
  element_type *var_00;
  type *this_00;
  type *this_01;
  reference __args;
  reference __in;
  type *__k;
  type *this_02;
  unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>
  *this_03;
  const_iterator __first;
  const_iterator __last;
  type *entry;
  type *var_1;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_false>
  local_108;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  type *__range2_1;
  value_type *var;
  const_iterator __end2;
  const_iterator __begin2;
  type *__range2;
  type *linked;
  type *dep;
  DepSet local_a0;
  pair<std::unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>,_std::unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>_>
  *local_30;
  undefined1 local_28 [8];
  shared_ptr<kratos::Var> predicate;
  IfStmt *stmt_local;
  CombinationBlockVisitor *this_local;
  
  predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)stmt;
  IfStmt::predicate((IfStmt *)local_28);
  var_00 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_28);
  get_dep(&local_a0,var_00);
  local_30 = &local_a0;
  this_00 = std::
            get<0ul,std::unordered_set<kratos::Var_const*,std::hash<kratos::Var_const*>,std::equal_to<kratos::Var_const*>,std::allocator<kratos::Var_const*>>,std::unordered_map<kratos::Var_const*,std::unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>,std::hash<kratos::Var_const*>,std::equal_to<kratos::Var_const*>,std::allocator<std::pair<kratos::Var_const*const,std::unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>>>>>
                      (local_30);
  this_01 = std::
            get<1ul,std::unordered_set<kratos::Var_const*,std::hash<kratos::Var_const*>,std::equal_to<kratos::Var_const*>,std::allocator<kratos::Var_const*>>,std::unordered_map<kratos::Var_const*,std::unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>,std::hash<kratos::Var_const*>,std::equal_to<kratos::Var_const*>,std::allocator<std::pair<kratos::Var_const*const,std::unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>>>>>
                      (local_30);
  __end2 = std::
           unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
           ::begin(this_00);
  var = (value_type *)
        std::
        unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
        ::end(this_00);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<const_kratos::Var_*,_false>,
                       (_Node_iterator_base<const_kratos::Var_*,_false> *)&var);
    if (!bVar1) break;
    __args = std::__detail::_Node_const_iterator<const_kratos::Var_*,_true,_false>::operator*
                       (&__end2);
    std::
    unordered_set<kratos::Var_const*,std::hash<kratos::Var_const*>,std::equal_to<kratos::Var_const*>,std::allocator<kratos::Var_const*>>
    ::emplace<kratos::Var_const*const&>
              ((unordered_set<kratos::Var_const*,std::hash<kratos::Var_const*>,std::equal_to<kratos::Var_const*>,std::allocator<kratos::Var_const*>>
                *)&this->vars_,__args);
    std::__detail::_Node_const_iterator<const_kratos::Var_*,_true,_false>::operator++(&__end2);
  }
  __end2_1 = std::
             unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
             ::begin(this_01);
  local_108._M_cur =
       (__node_type *)
       std::
       unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
       ::end(this_01);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2_1.
                        super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_false>
                       ,&local_108);
    if (!bVar1) break;
    __in = std::__detail::
           _Node_const_iterator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_false,_false>
           ::operator*(&__end2_1);
    __k = std::
          get<0ul,kratos::Var_const*const,std::unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>>
                    (__in);
    this_02 = std::
              get<1ul,kratos::Var_const*const,std::unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>>
                        (__in);
    this_03 = (unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>
               *)std::
                 unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
                 ::operator[](&this->linked_vars_,__k);
    __first = std::
              unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
              ::begin(this_02);
    __last = std::
             unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
             ::end(this_02);
    std::
    unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>
    ::
    insert<std::__detail::_Node_const_iterator<std::pair<unsigned_int_const,kratos::Var*>,false,false>>
              (this_03,(_Node_const_iterator<std::pair<const_unsigned_int,_kratos::Var_*>,_false,_false>
                        )__first.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>
                         ._M_cur,
               (_Node_const_iterator<std::pair<const_unsigned_int,_kratos::Var_*>,_false,_false>)
               __last.super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>
               ._M_cur);
    std::__detail::
    _Node_const_iterator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_false,_false>
    ::operator++(&__end2_1);
  }
  std::
  pair<std::unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>,_std::unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>_>
  ::~pair(&local_a0);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_28);
  return;
}

Assistant:

void visit(IfStmt *stmt) override {
            auto predicate = stmt->predicate();
            auto const &[dep, linked] = DependencyVisitor::get_dep(predicate.get());
            for (auto const &var : dep) vars_.emplace(var);
            for (auto const &[var, entry] : linked) {
                linked_vars_[var].insert(entry.begin(), entry.end());
            }
        }